

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

void util::rpn_map_multichar_op(string *str)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  if ((((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 != 0)) &&
      (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 != 0)) &&
     (((iVar1 = std::__cxx11::string::compare((char *)str), iVar1 != 0 &&
       (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 != 0)) &&
      (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 != 0)))) {
    return;
  }
  std::__cxx11::string::_M_replace_aux((ulong)str,0,str->_M_string_length,'\x01');
  return;
}

Assistant:

static void rpn_map_multichar_op(std::string& str)
{
	if (str == "==")
		str = '=';
	else if (str == "!=")
		str = op_ne;
	else if (str == "<=")
		str = op_lte;
	else if (str == ">=")
		str = op_gte;
	else if (str == "&&")
		str = op_and;
	else if (str == "||")
		str = op_or;
}